

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

shared_ptr<ast_funcfparam> dcast<ast_funcfparam,ast_nodebase>(shared_ptr<ast_nodebase> *r)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  __shared_ptr<ast_nodebase,_(__gnu_cxx::_Lock_policy)2> *in_RSI;
  shared_ptr<ast_funcfparam> sVar3;
  element_type *local_40;
  element_type *p;
  shared_ptr<ast_nodebase> *r_local;
  
  peVar1 = std::__shared_ptr<ast_nodebase,_(__gnu_cxx::_Lock_policy)2>::get(in_RSI);
  if (peVar1 == (element_type *)0x0) {
    local_40 = (element_type *)0x0;
  }
  else {
    local_40 = (element_type *)
               __dynamic_cast(peVar1,&ast_nodebase::typeinfo,&ast_funcfparam::typeinfo,0);
  }
  if (local_40 == (element_type *)0x0) {
    std::shared_ptr<ast_funcfparam>::shared_ptr((shared_ptr<ast_funcfparam> *)r);
    _Var2._M_pi = extraout_RDX_00;
  }
  else {
    std::shared_ptr<ast_funcfparam>::shared_ptr<ast_nodebase>
              ((shared_ptr<ast_funcfparam> *)r,(shared_ptr<ast_nodebase> *)in_RSI,local_40);
    _Var2._M_pi = extraout_RDX;
  }
  sVar3.super___shared_ptr<ast_funcfparam,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<ast_funcfparam,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)r;
  return (shared_ptr<ast_funcfparam>)
         sVar3.super___shared_ptr<ast_funcfparam,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> dcast( const std::shared_ptr<U>& r ) noexcept {
  if (auto p = dynamic_cast<typename std::shared_ptr<T>::element_type*>(r.get())) {
    return std::shared_ptr<T>(r, p);
  } else {
    return std::shared_ptr<T>();
  }
}